

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QNetworkAddressEntry>::Inserter::Inserter
          (Inserter *this,QArrayDataPointer<QNetworkAddressEntry> *d,qsizetype pos,qsizetype n)

{
  QNetworkAddressEntry *__src;
  size_t __n;
  
  this->data = d;
  __src = d->ptr + pos;
  this->displaceFrom = __src;
  this->displaceTo = __src + n;
  this->nInserts = n;
  __n = (d->size - pos) * 8;
  this->bytes = __n;
  memmove(__src + n,__src,__n);
  return;
}

Assistant:

explicit Inserter(QArrayDataPointer<T> *d, qsizetype pos, qsizetype n)
            : data{d},
              displaceFrom{d->ptr + pos},
              displaceTo{displaceFrom + n},
              nInserts{n},
              bytes{(data->size - pos) * sizeof(T)}
        {
            ::memmove(static_cast<void *>(displaceTo), static_cast<void *>(displaceFrom), bytes);
        }